

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

int secp256k1_musig_partial_sig_verify
              (secp256k1_context *ctx,secp256k1_musig_partial_sig *partial_sig,
              secp256k1_musig_pubnonce *pubnonce,secp256k1_pubkey *pubkey,
              secp256k1_musig_keyagg_cache *keyagg_cache,secp256k1_musig_session *session)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  secp256k1_ge pkp;
  secp256k1_gej tmp;
  secp256k1_gej rj;
  secp256k1_ge nonce_pts [2];
  secp256k1_gej pkj;
  secp256k1_scalar s;
  secp256k1_scalar e;
  secp256k1_scalar mu;
  secp256k1_musig_session_internal session_i;
  secp256k1_keyagg_cache_internal cache_i;
  secp256k1_keyagg_cache_internal *in_stack_fffffffffffffab8;
  secp256k1_keyagg_cache_internal *in_stack_fffffffffffffac0;
  secp256k1_context *in_stack_fffffffffffffac8;
  secp256k1_scalar *in_stack_fffffffffffffad0;
  secp256k1_scalar *in_stack_fffffffffffffaf0;
  secp256k1_scalar *in_stack_fffffffffffffaf8;
  secp256k1_scalar *in_stack_fffffffffffffb00;
  secp256k1_scalar *in_stack_fffffffffffffb50;
  secp256k1_ge *in_stack_fffffffffffffb58;
  secp256k1_gej *in_stack_fffffffffffffb60;
  secp256k1_fe *in_stack_fffffffffffffcc8;
  secp256k1_gej *in_stack_fffffffffffffcd0;
  secp256k1_gej *in_stack_fffffffffffffcd8;
  secp256k1_gej *in_stack_fffffffffffffce0;
  int local_1d8;
  int local_40;
  int local_4;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/musig/session_impl.h"
            ,0x2ea,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8);
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8);
    local_4 = 0;
  }
  else if (in_RCX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8);
    local_4 = 0;
  }
  else if (in_R8 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8);
    local_4 = 0;
  }
  else if (in_R9 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8);
    local_4 = 0;
  }
  else {
    iVar1 = secp256k1_musig_session_load
                      (in_stack_fffffffffffffac8,
                       (secp256k1_musig_session_internal *)in_stack_fffffffffffffac0,
                       (secp256k1_musig_session *)in_stack_fffffffffffffab8);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      iVar1 = secp256k1_musig_pubnonce_load
                        (in_stack_fffffffffffffac8,&in_stack_fffffffffffffac0->pk,
                         (secp256k1_musig_pubnonce *)in_stack_fffffffffffffab8);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        secp256k1_effective_nonce
                  (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
        iVar1 = secp256k1_pubkey_load
                          (in_stack_fffffffffffffac8,&in_stack_fffffffffffffac0->pk,
                           (secp256k1_pubkey *)in_stack_fffffffffffffab8);
        if (iVar1 == 0) {
          local_4 = 0;
        }
        else {
          iVar1 = secp256k1_keyagg_cache_load
                            (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
                             (secp256k1_musig_keyagg_cache *)in_stack_fffffffffffffab8);
          if (iVar1 == 0) {
            local_4 = 0;
          }
          else {
            secp256k1_musig_keyaggcoef
                      ((secp256k1_scalar *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                       (secp256k1_ge *)0x10d878);
            secp256k1_scalar_mul
                      (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0
                      );
            iVar1 = secp256k1_fe_is_odd((secp256k1_fe *)0x10d8aa);
            if (iVar1 != local_40) {
              secp256k1_scalar_negate
                        (in_stack_fffffffffffffad0,(secp256k1_scalar *)in_stack_fffffffffffffac8);
            }
            iVar1 = secp256k1_musig_partial_sig_load
                              (in_stack_fffffffffffffac8,
                               (secp256k1_scalar *)in_stack_fffffffffffffac0,
                               (secp256k1_musig_partial_sig *)in_stack_fffffffffffffab8);
            if (iVar1 == 0) {
              local_4 = 0;
            }
            else {
              secp256k1_scalar_negate
                        (in_stack_fffffffffffffad0,(secp256k1_scalar *)in_stack_fffffffffffffac8);
              secp256k1_gej_set_ge
                        ((secp256k1_gej *)in_stack_fffffffffffffac0,&in_stack_fffffffffffffab8->pk);
              secp256k1_ecmult((secp256k1_gej *)session_i.challenge.d[1],
                               (secp256k1_gej *)session_i.challenge.d[0],
                               (secp256k1_scalar *)session_i.noncecoef.d[3],
                               (secp256k1_scalar *)session_i.noncecoef.d[2]);
              if (local_1d8 != 0) {
                secp256k1_gej_neg((secp256k1_gej *)in_stack_fffffffffffffac0,
                                  (secp256k1_gej *)in_stack_fffffffffffffab8);
              }
              secp256k1_gej_add_var
                        (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                         in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
              local_4 = secp256k1_gej_is_infinity((secp256k1_gej *)0x10d976);
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int secp256k1_musig_partial_sig_verify(const secp256k1_context* ctx, const secp256k1_musig_partial_sig *partial_sig, const secp256k1_musig_pubnonce *pubnonce, const secp256k1_pubkey *pubkey, const secp256k1_musig_keyagg_cache *keyagg_cache, const secp256k1_musig_session *session) {
    secp256k1_keyagg_cache_internal cache_i;
    secp256k1_musig_session_internal session_i;
    secp256k1_scalar mu, e, s;
    secp256k1_gej pkj;
    secp256k1_ge nonce_pts[2];
    secp256k1_gej rj;
    secp256k1_gej tmp;
    secp256k1_ge pkp;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(partial_sig != NULL);
    ARG_CHECK(pubnonce != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(keyagg_cache != NULL);
    ARG_CHECK(session != NULL);

    if (!secp256k1_musig_session_load(ctx, &session_i, session)) {
        return 0;
    }

    if (!secp256k1_musig_pubnonce_load(ctx, nonce_pts, pubnonce)) {
        return 0;
    }
    /* Compute "effective" nonce rj = nonce_pts[0] + b*nonce_pts[1] */
    /* TODO: use multiexp to compute -s*G + e*mu*pubkey + nonce_pts[0] + b*nonce_pts[1] */
    secp256k1_effective_nonce(&rj, nonce_pts, &session_i.noncecoef);

    if (!secp256k1_pubkey_load(ctx, &pkp, pubkey)) {
        return 0;
    }
    if (!secp256k1_keyagg_cache_load(ctx, &cache_i, keyagg_cache)) {
        return 0;
    }
    /* Multiplying the challenge by the KeyAgg coefficient is equivalent
     * to multiplying the signer's public key by the coefficient, except
     * much easier to do. */
    secp256k1_musig_keyaggcoef(&mu, &cache_i, &pkp);
    secp256k1_scalar_mul(&e, &session_i.challenge, &mu);

    /* Negate e if secp256k1_fe_is_odd(&cache_i.pk.y)) XOR cache_i.parity_acc.
     * This corresponds to the line "Let g' = g⋅gacc mod n" and the multiplication "g'⋅e"
     * in the specification. */
    if (secp256k1_fe_is_odd(&cache_i.pk.y)
            != cache_i.parity_acc) {
        secp256k1_scalar_negate(&e, &e);
    }

    if (!secp256k1_musig_partial_sig_load(ctx, &s, partial_sig)) {
        return 0;
    }
    /* Compute -s*G + e*pkj + rj (e already includes the keyagg coefficient mu) */
    secp256k1_scalar_negate(&s, &s);
    secp256k1_gej_set_ge(&pkj, &pkp);
    secp256k1_ecmult(&tmp, &pkj, &e, &s);
    if (session_i.fin_nonce_parity) {
        secp256k1_gej_neg(&rj, &rj);
    }
    secp256k1_gej_add_var(&tmp, &tmp, &rj, NULL);

    return secp256k1_gej_is_infinity(&tmp);
}